

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::~ThreadedSocketInitiator(ThreadedSocketInitiator *this)

{
  ThreadedSocketInitiator *this_local;
  
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__ThreadedSocketInitiator_003316a0;
  socket_term();
  Mutex::~Mutex(&this->m_mutex);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  ~map(&this->m_threads);
  HostDetailsProvider::~HostDetailsProvider(&this->m_hostDetailsProvider);
  SessionSettings::~SessionSettings(&this->m_settings);
  Initiator::~Initiator(&this->super_Initiator);
  return;
}

Assistant:

ThreadedSocketInitiator::~ThreadedSocketInitiator() { socket_term(); }